

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O3

OperatorResultType
duckdb::RangeDateTimeFunction<true>
          (ExecutionContext *context,TableFunctionInput *data_p,DataChunk *input,DataChunk *output)

{
  LocalTableFunctionState *pLVar1;
  unsigned_long *puVar2;
  _func_int **pp_Var3;
  _func_int **pp_Var4;
  _func_int **pp_Var5;
  data_ptr_t pdVar6;
  reference pvVar7;
  _func_int **pp_Var8;
  timestamp_t tVar9;
  BinderException *pBVar10;
  undefined1 uVar11;
  undefined7 uVar13;
  int64_t iVar12;
  size_type __n;
  idx_t entry_idx;
  ulong uVar14;
  interval_t right;
  string local_58;
  LocalTableFunctionState *local_38;
  
  optional_ptr<duckdb::LocalTableFunctionState,_true>::CheckValid(&data_p->local_state);
  pLVar1 = (data_p->local_state).ptr;
  local_38 = pLVar1 + 4;
  if (((ulong)pLVar1[1]._vptr_LocalTableFunctionState & 1) != 0) goto LAB_01534225;
  do {
    pp_Var8 = pLVar1[2]._vptr_LocalTableFunctionState;
    if ((_func_int **)input->count <= pp_Var8) {
      pLVar1[2]._vptr_LocalTableFunctionState = (_func_int **)0x0;
      *(undefined1 *)&pLVar1[1]._vptr_LocalTableFunctionState = 0;
      return NEED_MORE_INPUT;
    }
    DataChunk::Flatten(input);
    if ((input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_start) {
      __n = 0;
      do {
        pvVar7 = vector<duckdb::Vector,_true>::operator[](&input->data,__n);
        puVar2 = (pvVar7->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar2 != (unsigned_long *)0x0) &&
           ((puVar2[(ulong)pp_Var8 >> 6] & 1L << ((byte)pp_Var8 & 0x3f)) == 0)) {
          local_38[2]._vptr_LocalTableFunctionState = (_func_int **)0x0;
          local_38[3]._vptr_LocalTableFunctionState = (_func_int **)0x0;
          local_38->_vptr_LocalTableFunctionState = (_func_int **)0x0;
          local_38[1]._vptr_LocalTableFunctionState = (_func_int **)0x0;
          *(undefined1 *)((long)&pLVar1[8]._vptr_LocalTableFunctionState + 1) = 1;
          pp_Var8 = (_func_int **)0x0;
          uVar11 = 0;
          goto LAB_01534218;
        }
        __n = __n + 1;
      } while (__n < (ulong)(((long)(input->data).
                                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(input->data).
                                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            0x4ec4ec4ec4ec4ec5));
    }
    pvVar7 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
    pLVar1[4]._vptr_LocalTableFunctionState = *(_func_int ***)(pvVar7->data + (long)pp_Var8 * 8);
    pvVar7 = vector<duckdb::Vector,_true>::operator[](&input->data,1);
    pLVar1[5]._vptr_LocalTableFunctionState = *(_func_int ***)(pvVar7->data + (long)pp_Var8 * 8);
    pvVar7 = vector<duckdb::Vector,_true>::operator[](&input->data,2);
    pp_Var3 = *(_func_int ***)(pvVar7->data + (long)pp_Var8 * 0x10);
    pp_Var4 = *(_func_int ***)(pvVar7->data + (long)pp_Var8 * 0x10 + 8);
    pLVar1[6]._vptr_LocalTableFunctionState = pp_Var3;
    pLVar1[7]._vptr_LocalTableFunctionState = pp_Var4;
    pp_Var8 = pLVar1[4]._vptr_LocalTableFunctionState;
    if ((((pp_Var8 == (_func_int **)0x8000000000000001) ||
         (pp_Var8 == (_func_int **)0x7fffffffffffffff)) ||
        (pp_Var5 = pLVar1[5]._vptr_LocalTableFunctionState,
        pp_Var5 == (_func_int **)0x7fffffffffffffff)) ||
       (pp_Var5 == (_func_int **)0x8000000000000001)) {
      pBVar10 = (BinderException *)__cxa_allocate_exception(0x10);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"RANGE with infinite bounds is not supported","");
      BinderException::BinderException(pBVar10,&local_58);
      __cxa_throw(pBVar10,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((pp_Var4 == (_func_int **)0x0 && (int)pp_Var3 == 0) && (ulong)pp_Var3 >> 0x20 == 0) {
      pBVar10 = (BinderException *)__cxa_allocate_exception(0x10);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"interval cannot be 0!","");
      BinderException::BinderException(pBVar10,&local_58);
      __cxa_throw(pBVar10,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (((long)pp_Var4 < 1 && (int)pp_Var3 < 1) && (int)((ulong)pp_Var3 >> 0x20) < 1) {
      *(undefined1 *)((long)&pLVar1[8]._vptr_LocalTableFunctionState + 1) = 0;
      uVar11 = 1;
      if ((long)pp_Var8 < (long)pp_Var5) goto LAB_015341f7;
    }
    else {
      if ((((ulong)pp_Var3 & 0x8000000080000000) != 0) || ((long)pp_Var4 < 0)) {
        pBVar10 = (BinderException *)__cxa_allocate_exception(0x10);
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,
                   "RANGE with composite interval that has mixed signs is not supported","");
        BinderException::BinderException(pBVar10,&local_58);
        __cxa_throw(pBVar10,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      *(undefined1 *)((long)&pLVar1[8]._vptr_LocalTableFunctionState + 1) = 1;
      uVar11 = 1;
      if ((long)pp_Var5 < (long)pp_Var8) {
LAB_015341f7:
        *(undefined1 *)((long)&pLVar1[8]._vptr_LocalTableFunctionState + 2) = 1;
        uVar11 = 1;
      }
    }
LAB_01534218:
    *(undefined1 *)&pLVar1[8]._vptr_LocalTableFunctionState = uVar11;
    *(undefined1 *)&pLVar1[1]._vptr_LocalTableFunctionState = 1;
    pLVar1[3]._vptr_LocalTableFunctionState = pp_Var8;
LAB_01534225:
    if (*(char *)((long)&pLVar1[8]._vptr_LocalTableFunctionState + 2) == '\x01') {
      output->count = 0;
      pLVar1[2]._vptr_LocalTableFunctionState =
           (_func_int **)((long)pLVar1[2]._vptr_LocalTableFunctionState + 1);
      *(undefined1 *)&pLVar1[1]._vptr_LocalTableFunctionState = 0;
      return HAVE_MORE_OUTPUT;
    }
    uVar14 = 0;
    pvVar7 = vector<duckdb::Vector,_true>::operator[](&output->data,0);
    pdVar6 = pvVar7->data;
    tVar9.value = (int64_t)pLVar1[3]._vptr_LocalTableFunctionState;
    while( true ) {
      pp_Var8 = pLVar1[5]._vptr_LocalTableFunctionState;
      uVar13 = (undefined7)((ulong)pp_Var8 >> 8);
      if (*(char *)((long)&pLVar1[8]._vptr_LocalTableFunctionState + 1) == '\x01') {
        if (*(char *)&pLVar1[8]._vptr_LocalTableFunctionState == '\0') {
          iVar12 = CONCAT71(uVar13,(long)pp_Var8 <= tVar9.value);
        }
        else {
          iVar12 = CONCAT71(uVar13,(long)pp_Var8 < tVar9.value);
        }
      }
      else if (*(char *)&pLVar1[8]._vptr_LocalTableFunctionState == '\0') {
        iVar12 = CONCAT71(uVar13,tVar9.value <= (long)pp_Var8);
      }
      else {
        iVar12 = CONCAT71(uVar13,tVar9.value < (long)pp_Var8);
      }
      if (((char)iVar12 != '\0') || (0x7ff < uVar14)) break;
      *(int64_t *)(pdVar6 + uVar14 * 8) = tVar9.value;
      uVar14 = uVar14 + 1;
      right.micros = iVar12;
      right._0_8_ = pLVar1[7]._vptr_LocalTableFunctionState;
      tVar9 = AddOperator::Operation<duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t>
                        ((AddOperator *)pLVar1[3]._vptr_LocalTableFunctionState,
                         (timestamp_t)pLVar1[6]._vptr_LocalTableFunctionState,right);
      pLVar1[3]._vptr_LocalTableFunctionState = (_func_int **)tVar9.value;
    }
    if (uVar14 != 0) {
      output->count = uVar14;
      return HAVE_MORE_OUTPUT;
    }
    pLVar1[2]._vptr_LocalTableFunctionState =
         (_func_int **)((long)pLVar1[2]._vptr_LocalTableFunctionState + 1);
    *(undefined1 *)&pLVar1[1]._vptr_LocalTableFunctionState = 0;
  } while( true );
}

Assistant:

static OperatorResultType RangeDateTimeFunction(ExecutionContext &context, TableFunctionInput &data_p, DataChunk &input,
                                                DataChunk &output) {
	auto &state = data_p.local_state->Cast<RangeDateTimeLocalState>();
	while (true) {
		if (!state.initialized_row) {
			// initialize for the current input row
			if (state.current_input_row >= input.size()) {
				// ran out of rows
				state.current_input_row = 0;
				state.initialized_row = false;
				return OperatorResultType::NEED_MORE_INPUT;
			}
			GenerateRangeDateTimeParameters<GENERATE_SERIES>(input, state.current_input_row, state);
			state.initialized_row = true;
			state.current_state = state.start;
		}
		if (state.empty_range) {
			// empty range
			output.SetCardinality(0);
			state.current_input_row++;
			state.initialized_row = false;
			return OperatorResultType::HAVE_MORE_OUTPUT;
		}
		idx_t size = 0;
		auto data = FlatVector::GetData<timestamp_t>(output.data[0]);
		while (true) {
			if (state.Finished(state.current_state)) {
				break;
			}
			if (size >= STANDARD_VECTOR_SIZE) {
				break;
			}
			data[size++] = state.current_state;
			state.current_state =
			    AddOperator::Operation<timestamp_t, interval_t, timestamp_t>(state.current_state, state.increment);
		}
		if (size == 0) {
			// move to next row
			state.current_input_row++;
			state.initialized_row = false;
			continue;
		}
		output.SetCardinality(size);
		return OperatorResultType::HAVE_MORE_OUTPUT;
	}
}